

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summaryindex.cpp
# Opt level: O2

void summaryindex::indexevents
               (string *binfilename,string *idxfilename,
               map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
               *summaryfileperiod_to_offset,int file_id,
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               *eventtoperiods)

{
  _Base_ptr p_Var1;
  int iVar2;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar3;
  const_iterator cVar4;
  mapped_type *this;
  pointer pcVar5;
  _Base_ptr p_Var6;
  longlong offset;
  summary_period k;
  summarySampleslevelHeader sh;
  char line [4096];
  
  __stream = fopen((idxfilename->_M_dataplus)._M_p,"r");
  if (__stream == (FILE *)0x0) {
    pcVar5 = (idxfilename->_M_dataplus)._M_p;
  }
  else {
    __stream_00 = fopen((binfilename->_M_dataplus)._M_p,"r");
    if (__stream_00 != (FILE *)0x0) {
      k.fileindex = file_id;
      while( true ) {
        pcVar3 = fgets(line,0x1000,__stream);
        if (pcVar3 == (char *)0x0) {
          fclose(__stream);
          fclose(__stream_00);
          return;
        }
        iVar2 = __isoc99_sscanf(line,"%d,%lld",&k,&offset);
        if (iVar2 != 2) break;
        fseek(__stream_00,offset,0);
        fread(&sh,0xc,1,__stream_00);
        cVar4 = std::
                _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::find(&eventtoperiods->_M_t,&sh.event_id);
        if ((_Rb_tree_header *)cVar4._M_node !=
            &(eventtoperiods->_M_t)._M_impl.super__Rb_tree_header) {
          p_Var1 = cVar4._M_node[1]._M_left;
          for (p_Var6 = cVar4._M_node[1]._M_parent; p_Var6 != p_Var1;
              p_Var6 = (_Base_ptr)&p_Var6->field_0x4) {
            k.period_no = p_Var6->_M_color;
            this = std::
                   map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                   ::operator[](summaryfileperiod_to_offset,&k);
            std::vector<long_long,_std::allocator<long_long>_>::push_back(this,&offset);
          }
        }
      }
      fprintf(_stderr,"FATAL: Invalid data in file %s:\n%s",(idxfilename->_M_dataplus)._M_p,line);
      goto LAB_00107670;
    }
    pcVar5 = (binfilename->_M_dataplus)._M_p;
  }
  fprintf(_stderr,"FATAL: Cannot open %s\n",pcVar5);
LAB_00107670:
  exit(1);
}

Assistant:

void indexevents(const std::string &binfilename, std::string &idxfilename, std::map<summary_period, std::vector<long long>> &summaryfileperiod_to_offset, int file_id, const std::map<int, std::vector<int>> &eventtoperiods) {

		FILE * fidx = fopen(idxfilename.c_str(), "r");
		if (fidx == nullptr) {
			fprintf(stderr, "FATAL: Cannot open %s\n", idxfilename.c_str());
			exit(EXIT_FAILURE);
		}
		FILE * fbin = fopen(binfilename.c_str(), "r");
		if (fbin == nullptr) {
			fprintf(stderr, "FATAL: Cannot open %s\n", binfilename.c_str());
			exit(EXIT_FAILURE);
		}

		char line[4096];
		summary_period k;
		k.fileindex = file_id;
		while (fgets(line, sizeof(line), fidx) != 0) {
			long long offset;
			int ret = sscanf(line, "%d,%lld", &k.summary_id, &offset);
			if (ret != 2) {
				fprintf(stderr, "FATAL: Invalid data in file %s:\n%s", idxfilename.c_str(), line);
				exit(EXIT_FAILURE);
			}
			// Get period numbers from event IDs
			flseek(fbin, offset, SEEK_SET);
			summarySampleslevelHeader sh;
			fread(&sh, sizeof(sh), 1, fbin);
			std::map<int, std::vector<int>>::const_iterator iter = eventtoperiods.find(sh.event_id);
			if (iter == eventtoperiods.end()) continue;   // Event not found so don't process it
			for (auto period : iter->second) {
				k.period_no = period;
				summaryfileperiod_to_offset[k].push_back(offset);
			}
		}

		fclose(fidx);
		fclose(fbin);

	}